

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseElementEnd(xmlParserCtxtPtr ctxt)

{
  xmlNodePtr pxVar1;
  int nsNr;
  xmlChar *URI;
  xmlChar *prefix;
  xmlNodePtr ret;
  xmlParserNodeInfo node_info;
  xmlParserCtxtPtr ctxt_local;
  
  pxVar1 = ctxt->node;
  if (0 < ctxt->nameNr) {
    node_info.end_line = (unsigned_long)ctxt;
    if (ctxt->sax2 == 0) {
      xmlParseEndTag1(ctxt,0);
    }
    else {
      xmlParseEndTag2(ctxt,(xmlChar *)ctxt->pushTab[ctxt->nameNr * 3 + -3],
                      (xmlChar *)ctxt->pushTab[ctxt->nameNr * 3 + -2],0,
                      (int)ctxt->pushTab[ctxt->nameNr * 3 + -1],0);
      namePop((xmlParserCtxtPtr)node_info.end_line);
    }
    if ((pxVar1 != (xmlNodePtr)0x0) && (*(int *)(node_info.end_line + 0x68) != 0)) {
      node_info.begin_line =
           *(long *)(*(long *)(node_info.end_line + 0x38) + 0x40) +
           (*(long *)(*(long *)(node_info.end_line + 0x38) + 0x20) -
           *(long *)(*(long *)(node_info.end_line + 0x38) + 0x18));
      node_info.end_pos = (unsigned_long)*(int *)(*(long *)(node_info.end_line + 0x38) + 0x34);
      ret = pxVar1;
      xmlParserAddNodeInfo((xmlParserCtxtPtr)node_info.end_line,(xmlParserNodeInfoPtr)&ret);
    }
  }
  return;
}

Assistant:

static void
xmlParseElementEnd(xmlParserCtxtPtr ctxt) {
    xmlParserNodeInfo node_info;
    xmlNodePtr ret = ctxt->node;

    if (ctxt->nameNr <= 0)
        return;

    /*
     * parse the end of tag: '</' should be here.
     */
    if (ctxt->sax2) {
        const xmlChar *prefix = ctxt->pushTab[ctxt->nameNr * 3 - 3];
        const xmlChar *URI = ctxt->pushTab[ctxt->nameNr * 3 - 2];
        int nsNr = (ptrdiff_t) ctxt->pushTab[ctxt->nameNr * 3 - 1];
	xmlParseEndTag2(ctxt, prefix, URI, 0, nsNr, 0);
	namePop(ctxt);
    }
#ifdef LIBXML_SAX1_ENABLED
    else
	xmlParseEndTag1(ctxt, 0);
#endif /* LIBXML_SAX1_ENABLED */

    /*
     * Capture end position and add node
     */
    if ( ret != NULL && ctxt->record_info ) {
       node_info.end_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
       node_info.end_line = ctxt->input->line;
       node_info.node = ret;
       xmlParserAddNodeInfo(ctxt, &node_info);
    }
}